

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClassDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClassDeclarationSyntax,slang::syntax::ClassDeclarationSyntax_const&>
          (BumpAllocator *this,ClassDeclarationSyntax *args)

{
  ClassDeclarationSyntax *pCVar1;
  ClassDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ClassDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ClassDeclarationSyntax::ClassDeclarationSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }